

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

uint8 __thiscall rw::ColorQuant::findColor(ColorQuant *this,RGBA color)

{
  uint32 addr;
  Node *pNVar1;
  ColorQuant *this_00;
  
  this_00 = (ColorQuant *)(ulong)(uint)color;
  addr = makeTreeAddr(color);
  pNVar1 = findNode(this_00,this->root,addr,8);
  return (uint8)pNVar1->numPixels;
}

Assistant:

uint8
ColorQuant::findColor(RGBA color)
{
	uint32 addr = makeTreeAddr(color);
	ColorQuant::Node *node = this->findNode(root, addr, QUANTDEPTH);
	return node->numPixels;
}